

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O3

int adiak_mpi_version(void)

{
  return -1;
}

Assistant:

int adiak_mpi_version()
{
#if defined(USE_MPI)
   char buf[16];
   int result = -1;
   if (adiak_config->use_mpi)
      result = adksys_mpi_version(buf, 16);
   if (result == -1)
      return -1;
   return adiak_namevalue("mpi_version", adiak_general, "mpi", "%v", buf);
#endif
   return -1;
}